

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondStamp.hpp
# Opt level: O0

void __thiscall OpenMD::BondStamp::overrideType(BondStamp *this,string *type,RealType pars)

{
  string *in_RSI;
  long in_RDI;
  value_type_conflict2 *in_XMM0_Qa;
  
  std::__cxx11::string::operator=((string *)(in_RDI + 0xb0),in_RSI);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)in_RSI,in_XMM0_Qa);
  *(undefined1 *)(in_RDI + 0xa8) = 1;
  return;
}

Assistant:

void overrideType(std::string type, RealType pars) {
      orType_ = type;
      orPars_.push_back(pars);
      hasOverride_ = true;
    }